

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

iterator __thiscall
bk_lib::pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_>::erase
          (pod_vector<Clasp::ImpliedLiteral,_std::allocator<Clasp::ImpliedLiteral>_> *this,
          iterator first,iterator last)

{
  uint uVar1;
  size_t __n;
  
  uVar1 = (this->ebo_).size;
  __n = (long)(this->ebo_).buf + ((ulong)uVar1 * 0x18 - (long)last);
  if (0 < (long)__n) {
    memmove(first,last,__n);
    uVar1 = (this->ebo_).size;
  }
  (this->ebo_).size = (int)(((long)last - (long)first) / -0x18) + uVar1;
  return first;
}

Assistant:

iterator erase(iterator first, iterator last) {
		if (end() - last > 0) {
			std::memmove(first, last, (end() - last) * sizeof(T));
		}
		ebo_.size -= static_cast<size_type>(last - first);
		return first;
	}